

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O2

double __thiscall VCClusterAniso::energyWithItem(VCClusterAniso *this,VCFace *f)

{
  VCClusterAniso *this_00;
  ResScalar RVar1;
  ResScalar RVar2;
  Vector3d sKP;
  Vector3d zi;
  Matrix3d sK;
  undefined1 local_e0 [8];
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *local_d8;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_b8 [24];
  Matrix3d *local_a0;
  Vector3d *local_98;
  Matrix<double,_3,_3,_0,_3,_3> local_78;
  
  local_e0 = (undefined1  [8])&this->sumK;
  local_d8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&f->K;
  Eigen::internal::
  assign_LinearTraversal_CompleteUnrolling<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0,_9>
  ::run(&local_78,
        (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
         *)local_e0);
  local_e0 = (undefined1  [8])&this->sumKPos;
  local_98 = &f->center;
  local_a0 = &f->K;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  lazyAssign<Eigen::CoeffBasedProduct<Eigen::Matrix<double,3,3,0,3,3>const&,Eigen::Matrix<double,3,1,0,3,1>const&,6>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_d8,
             (DenseBase<Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_6>_>
              *)&local_a0);
  this_00 = (VCClusterAniso *)local_e0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CoeffBasedProduct<Eigen::Matrix<double,3,3,0,3,3>const&,Eigen::Matrix<double,3,1,0,3,1>const&,6>const>>
            (local_b8,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_6>_>_>
                       *)this_00);
  center((Vector3d *)&local_a0,this_00,&local_78,(Vector3d *)local_b8);
  local_e0 = (undefined1  [8])&local_78;
  local_d8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_a0;
  RVar1 = Eigen::internal::
          dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_6>,_false>
          ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_a0,
                (MatrixBase<Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_6>_>
                 *)local_e0);
  RVar2 = Eigen::internal::
          dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
          ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_a0,
                (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_b8);
  return RVar1 - (RVar2 + RVar2);
}

Assistant:

double VCClusterAniso::energyWithItem(VCFace* f) {
	Matrix3d sK = sumK + f->K;
	Vector3d sKP = sumKPos + f->K * f->center;
	Vector3d zi = center(sK, sKP);
	return zi.dot(sK * zi) - 2 * zi.dot(sKP);
}